

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O2

void * atomic_mmu_lookup(CPUArchState_conflict30 *env,target_ulong_conflict addr,TCGMemOpIdx oi,
                        uintptr_t retaddr)

{
  long lVar1;
  _Bool _Var2;
  uint uVar3;
  uint uVar4;
  ulong mem_vaddr;
  uint mmu_idx;
  ulong uVar5;
  uint *puVar6;
  uintptr_t retaddr_00;
  CPUTriCoreState *__mptr;
  uint local_48;
  ulong mmu_idx_00;
  
  mmu_idx = oi & 0xf;
  mmu_idx_00 = (ulong)mmu_idx;
  uVar5 = (ulong)(mmu_idx << 4);
  local_48 = *(uint *)((long)env->gpr_a + (uVar5 - 0x40)) >> 6 & addr >> 0xe;
  lVar1 = *(long *)((long)env->gpr_a + (uVar5 - 0x38));
  uVar4 = *(uint *)(lVar1 + 4 + (ulong)(local_48 << 6));
  uVar3 = get_alignment_bits(oi >> 4);
  retaddr_00 = retaddr - 2;
  mem_vaddr = (ulong)addr;
  if ((uVar3 != 0) && ((~(-1 << ((byte)uVar3 & 0x1f)) & addr) != 0)) {
    (**(code **)(*(long *)&env[-4].end_reset_fields + 0x18))
              (&env[-0x32].cpu_model,mem_vaddr,1,mmu_idx_00,retaddr_00);
  }
  uVar3 = 1 << ((byte)(oi >> 4) & 3);
  if ((uVar3 - 1 & addr) == 0) {
    puVar6 = (uint *)(lVar1 + (ulong)(local_48 << 6));
    if ((uVar4 & 0xffffe000) != (addr & 0xffffc000)) {
      _Var2 = victim_tlb_hit(env,mmu_idx_00,(ulong)local_48,4,addr & 0xffffc000);
      if (!_Var2) {
        tlb_fill((CPUState *)&env[-0x32].cpu_model,addr,uVar3,MMU_DATA_STORE,mmu_idx,retaddr_00);
        local_48 = addr >> 0xe & *(uint *)((long)env->gpr_a + (uVar5 - 0x40)) >> 6;
        puVar6 = (uint *)((ulong)(local_48 << 6) + *(long *)((long)env->gpr_a + (uVar5 - 0x38)));
      }
      uVar4 = puVar6[1] & 0xffffdfff;
    }
    if ((uVar4 >> 0xb & 1) == 0) {
      if (*puVar6 == (uVar4 & 0xffffe7ff)) {
        lVar1 = *(long *)(puVar6 + 4);
        if ((uVar4 >> 0xc & 1) != 0) {
          notdirty_write((CPUState *)&env[-0x32].cpu_model,mem_vaddr,uVar3,
                         (CPUIOTLBEntry *)
                         (*(long *)((long)env + mmu_idx_00 * 0x2b0 + -0x5a8) +
                         (ulong)(local_48 << 4)),retaddr_00);
        }
        return (void *)(lVar1 + mem_vaddr);
      }
      tlb_fill((CPUState *)&env[-0x32].cpu_model,addr,uVar3,MMU_DATA_LOAD,mmu_idx,retaddr_00);
    }
  }
  cpu_loop_exit_atomic_tricore((CPUState_conflict *)&env[-0x32].cpu_model,retaddr_00);
}

Assistant:

static void *atomic_mmu_lookup(CPUArchState *env, target_ulong addr,
                               TCGMemOpIdx oi, uintptr_t retaddr)
{
#ifdef TARGET_ARM
    struct uc_struct *uc = env->uc;
#endif
    size_t mmu_idx = get_mmuidx(oi);
    uintptr_t index = tlb_index(env, mmu_idx, addr);
    CPUTLBEntry *tlbe = tlb_entry(env, mmu_idx, addr);
    target_ulong tlb_addr = tlb_addr_write(tlbe);
    MemOp mop = get_memop(oi);
    int a_bits = get_alignment_bits(mop);
    int s_bits = mop & MO_SIZE;
    void *hostaddr;

    /* Adjust the given return address.  */
    retaddr -= GETPC_ADJ;

    /* Enforce guest required alignment.  */
    if (unlikely(a_bits > 0 && (addr & ((1 << a_bits) - 1)))) {
        /* ??? Maybe indicate atomic op to cpu_unaligned_access */
        cpu_unaligned_access(env_cpu(env), addr, MMU_DATA_STORE,
                             mmu_idx, retaddr);
    }

    /* Enforce qemu required alignment.  */
    if (unlikely(addr & ((1 << s_bits) - 1))) {
        /* We get here if guest alignment was not requested,
           or was not enforced by cpu_unaligned_access above.
           We might widen the access and emulate, but for now
           mark an exception and exit the cpu loop.  */
        goto stop_the_world;
    }

    /* Check TLB entry and enforce page permissions.  */
    if (!tlb_hit(env->uc, tlb_addr, addr)) {
        if (!VICTIM_TLB_HIT(addr_write, addr)) {
            tlb_fill(env_cpu(env), addr, 1 << s_bits, MMU_DATA_STORE,
                     mmu_idx, retaddr);
            index = tlb_index(env, mmu_idx, addr);
            tlbe = tlb_entry(env, mmu_idx, addr);
        }
        tlb_addr = tlb_addr_write(tlbe) & ~TLB_INVALID_MASK;
    }

    /* Notice an IO access or a needs-MMU-lookup access */
    if (unlikely(tlb_addr & TLB_MMIO)) {
        /* There's really nothing that can be done to
           support this apart from stop-the-world.  */
        goto stop_the_world;
    }

    /* Let the guest notice RMW on a write-only page.  */
    if (unlikely(tlbe->addr_read != (tlb_addr & ~TLB_NOTDIRTY))) {
        tlb_fill(env_cpu(env), addr, 1 << s_bits, MMU_DATA_LOAD,
                 mmu_idx, retaddr);
        /* Since we don't support reads and writes to different addresses,
           and we do have the proper page loaded for write, this shouldn't
           ever return.  But just in case, handle via stop-the-world.  */
        goto stop_the_world;
    }

    hostaddr = (void *)((uintptr_t)addr + tlbe->addend);

    if (unlikely(tlb_addr & TLB_NOTDIRTY)) {
        notdirty_write(env_cpu(env), addr, 1 << s_bits,
                       &env_tlb(env)->d[mmu_idx].iotlb[index], retaddr);
    }

    return hostaddr;

 stop_the_world:
    cpu_loop_exit_atomic(env_cpu(env), retaddr);
}